

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh4asm_txt_emit.h
# Opt level: O0

char * sh4asm_bank_reg_str(uint idx)

{
  uint idx_local;
  
  return sh4asm_bank_reg_str::names[idx & 0xf];
}

Assistant:

static char const *sh4asm_bank_reg_str(unsigned idx) {
    static char const *names[16] = {
        "r0_bank",  "r1_bank",  "r2_bank",  "r3_bank",
        "r4_bank",  "r5_bank",  "r6_bank",  "r7_bank",
        "r8_bank",  "r9_bank",  "r10_bank", "r11_bank",
        "r12_bank", "r13_bank", "r14_bank", "r15_bank"
    };
    return names[idx & 15];
}